

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall JetHead::Socket::Socket(Socket *this,int fd)

{
  (this->super_SelectorListener)._vptr_SelectorListener =
       (_func_int **)&PTR_processFileEvents_00130850;
  (this->super_IReaderWriter)._vptr_IReaderWriter = (_func_int **)&PTR__Socket_00130898;
  this->mConnectedAsync = false;
  this->mListener = (SocketListener *)0x0;
  this->mFd = fd;
  this->mSelector = (Selector *)0x0;
  this->mConnected = false;
  this->mPrivateData = 0;
  this->mSockStream = true;
  this->mParent = this;
  this->mReadTimeout = 0;
  (this->mLastDatagramSender).mAddr.sin_family = 2;
  (this->mLastDatagramSender).mAddr.sin_port = 0;
  (this->mLastDatagramSender).mAddr.sin_addr.s_addr = 0;
  (this->mLastDatagramSender).mLen = 0x10;
  return;
}

Assistant:

Socket::Socket( int fd ) : 
	mConnectedAsync( false ),
	mListener( NULL ), 
	mFd( fd ),  
	mSelector( NULL ), 
	mConnected( false ), mPrivateData( 0 ), mSockStream( true ),
	mParent(this), mReadTimeout( 0 )
{
	TRACE_BEGIN( LOG_LVL_INFO );
}